

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

LOs __thiscall
Omega_h::find_unique(Omega_h *this,LOs *hv2v,Omega_h_Family family,Int high_dim,Int low_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this_00;
  long *plVar3;
  undefined8 *puVar4;
  ulong uVar5;
  Alloc *pAVar6;
  int iVar7;
  ulong *puVar8;
  ulong *puVar9;
  undefined8 uVar10;
  void *extraout_RDX;
  Int deg;
  char *pcVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  LOs LVar15;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Read<signed_char> codes;
  Read<int> uv2v_canon;
  LOs sorted2u;
  LOs e2sorted;
  Read<signed_char> jumps;
  LOs uv2v;
  LOs e2u;
  ScopedTimer local_1ea;
  ScopedTimer local_1e9;
  Read<int> local_1e8;
  undefined1 local_1d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  void *pvStack_1b0;
  Alloc *local_1a8;
  Alloc *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [48];
  undefined1 local_148 [24];
  undefined1 local_130 [16];
  void *local_120;
  LOs local_118;
  Read<signed_char> local_108;
  Alloc *local_f8;
  Alloc *local_f0;
  LOs local_e8;
  Alloc *local_d8;
  void *local_d0;
  Read<signed_char> local_c8;
  Alloc *local_b8;
  Alloc *local_b0;
  void *local_a8;
  undefined1 local_a0 [16];
  Write<int> local_90;
  LOs local_80;
  Alloc *local_70;
  void *local_68;
  LOs local_60;
  Read<int> local_50;
  LOs local_40;
  
  local_188._0_8_ = local_178;
  local_b8 = (Alloc *)this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar3 = (long *)std::__cxx11::string::append(local_188);
  puVar9 = (ulong *)(local_1c0._M_local_buf + 8);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_1c0._8_8_ = *puVar8;
    pvStack_1b0 = (void *)plVar3[3];
    local_1d8._16_8_ = puVar9;
  }
  else {
    local_1c0._8_8_ = *puVar8;
    local_1d8._16_8_ = (ulong *)*plVar3;
  }
  local_1c0._M_allocated_capacity = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1e8.write_.shared_alloc_.alloc = (Alloc *)local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1e8.write_.shared_alloc_.alloc,3,0x92);
  uVar10 = 0xf;
  if ((ulong *)local_1d8._16_8_ != puVar9) {
    uVar10 = local_1c0._8_8_;
  }
  if ((ulong)uVar10 <
      (long)local_1e8.write_.shared_alloc_.direct_ptr + local_1c0._M_allocated_capacity) {
    uVar5 = 0xf;
    if (local_1e8.write_.shared_alloc_.alloc != (Alloc *)local_1d8) {
      uVar5 = local_1d8._0_8_;
    }
    if (uVar5 < (long)local_1e8.write_.shared_alloc_.direct_ptr + local_1c0._M_allocated_capacity)
    goto LAB_001c74d9;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,local_1d8._16_8_);
  }
  else {
LAB_001c74d9:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_1d8 + 0x10,(ulong)local_1e8.write_.shared_alloc_.alloc);
  }
  local_1a8 = (Alloc *)local_198;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_198._0_8_ = *plVar3;
    local_198._8_8_ = puVar4[3];
  }
  else {
    local_198._0_8_ = *plVar3;
    local_1a8 = (Alloc *)*puVar4;
  }
  local_1a0 = (Alloc *)puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(char *)plVar3 = '\0';
  begin_code("find_unique",(char *)local_1a8);
  if (local_1a8 != (Alloc *)local_198) {
    operator_delete(local_1a8,(ulong)((long)(size_t *)local_198._0_8_ + 1));
  }
  if (local_1e8.write_.shared_alloc_.alloc != (Alloc *)local_1d8) {
    operator_delete(local_1e8.write_.shared_alloc_.alloc,local_1d8._0_8_ + 1);
  }
  if ((ulong *)local_1d8._16_8_ != puVar9) {
    operator_delete((void *)local_1d8._16_8_,local_1c0._8_8_ + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_178) {
    operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
  }
  if (high_dim <= low_dim) {
    uVar10 = 0x93;
    pcVar11 = "high_dim > low_dim";
LAB_001c8178:
    fail("assertion %s failed at %s +%d\n",pcVar11,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,uVar10);
  }
  if (2 < low_dim) {
    uVar10 = 0x94;
    pcVar11 = "low_dim <= 2";
    goto LAB_001c8178;
  }
  local_40.write_.shared_alloc_.alloc = (hv2v->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 1) == 0) {
    uVar5 = (local_40.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar5 = (ulong)local_40.write_.shared_alloc_.alloc >> 3;
  }
  if (family == OMEGA_H_SIMPLEX) {
    iVar7 = -1;
    if ((uint)high_dim < 4) {
      iVar7 = high_dim + 1;
    }
  }
  else {
    iVar7 = -1;
    if ((uint)high_dim < 4) {
      iVar7 = *(int *)(&DAT_00442ba8 + (ulong)(uint)high_dim * 4);
    }
  }
  if ((int)((long)((ulong)(uint)((int)(uVar5 >> 2) >> 0x1f) << 0x20 | uVar5 >> 2 & 0xffffffff) %
           (long)iVar7) != 0) {
    uVar10 = 0x95;
    pcVar11 = "hv2v.size() % element_degree(family, high_dim, VERT) == 0";
    goto LAB_001c8178;
  }
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_40.write_.shared_alloc_.alloc;
  local_40.write_.shared_alloc_.direct_ptr = (hv2v->write_).shared_alloc_.direct_ptr;
  form_uses((Omega_h *)local_a0,&local_40,family,high_dim,low_dim);
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  if (family == OMEGA_H_SIMPLEX) {
    deg = -1;
    if ((uint)low_dim < 3) {
      deg = low_dim + 1;
    }
  }
  else {
    deg = -1;
    if ((uint)low_dim < 3) {
      deg = *(Int *)(&DAT_00442714 + (ulong)(uint)low_dim * 4);
    }
  }
  local_b0 = (Alloc *)local_a0._0_8_;
  if ((local_a0._0_8_ & 7) == 0 && (Alloc *)local_a0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(*(size_t *)local_a0._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_a0._0_8_ + 0x30) = *(int *)(local_a0._0_8_ + 0x30) + 1;
    }
  }
  this_00 = local_b0;
  local_178._16_8_ = local_a0._8_8_;
  local_a8 = (void *)local_a0._8_8_;
  local_1e8.write_.shared_alloc_.alloc = (Alloc *)0x5d;
  local_188._0_8_ = (Alloc *)local_178;
  local_178._40_8_ = (Alloc *)local_a0;
  pAVar6 = (Alloc *)std::__cxx11::string::_M_create((ulong *)local_188,(ulong)&local_1e8);
  pAVar2 = local_1e8.write_.shared_alloc_.alloc;
  local_178._0_8_ = local_1e8.write_.shared_alloc_.alloc;
  local_188._0_8_ = pAVar6;
  memcpy(pAVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x5d);
  local_188._8_8_ = pAVar2;
  *(undefined1 *)((long)&pAVar2->size + (long)&pAVar6->size) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_188);
  uVar10 = local_178._16_8_;
  local_1d8._16_8_ = local_1c0._M_local_buf + 8;
  puVar9 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar9) {
    local_1c0._8_8_ = *puVar9;
    pvStack_1b0 = (void *)plVar3[3];
  }
  else {
    local_1c0._8_8_ = *puVar9;
    local_1d8._16_8_ = (ulong *)*plVar3;
  }
  local_1c0._M_allocated_capacity = plVar3[1];
  *plVar3 = (long)puVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1e8.write_.shared_alloc_.alloc = (Alloc *)local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1e8.write_.shared_alloc_.alloc,3,0x86);
  uVar12 = 0xf;
  if ((char *)local_1d8._16_8_ != local_1c0._M_local_buf + 8) {
    uVar12 = local_1c0._8_8_;
  }
  if ((ulong)uVar12 <
      (long)local_1e8.write_.shared_alloc_.direct_ptr + local_1c0._M_allocated_capacity) {
    uVar5 = 0xf;
    if (local_1e8.write_.shared_alloc_.alloc != (Alloc *)local_1d8) {
      uVar5 = local_1d8._0_8_;
    }
    if ((long)local_1e8.write_.shared_alloc_.direct_ptr + local_1c0._M_allocated_capacity <= uVar5)
    {
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_1e8,0,(char *)0x0,local_1d8._16_8_);
      goto LAB_001c7896;
    }
  }
  plVar3 = (long *)std::__cxx11::string::_M_append
                             (local_1d8 + 0x10,(ulong)local_1e8.write_.shared_alloc_.alloc);
LAB_001c7896:
  pAVar2 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar2) {
    local_198._0_8_ = pAVar2->size;
    local_198._8_8_ = plVar3[3];
    local_1a8 = (Alloc *)local_198;
  }
  else {
    local_198._0_8_ = pAVar2->size;
    local_1a8 = (Alloc *)*plVar3;
  }
  local_1a0 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar2;
  plVar3[1] = 0;
  *(undefined1 *)&pAVar2->size = 0;
  begin_code("find_unique_deg",(char *)local_1a8);
  if (local_1a8 != (Alloc *)local_198) {
    operator_delete(local_1a8,(ulong)((long)(size_t *)local_198._0_8_ + 1));
  }
  if (local_1e8.write_.shared_alloc_.alloc != (Alloc *)local_1d8) {
    operator_delete(local_1e8.write_.shared_alloc_.alloc,local_1d8._0_8_ + 1);
  }
  if ((char *)local_1d8._16_8_ != local_1c0._M_local_buf + 8) {
    operator_delete((void *)local_1d8._16_8_,local_1c0._8_8_ + 1);
  }
  if ((Alloc *)local_188._0_8_ != (Alloc *)local_178) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
  }
  bVar13 = this_00 != (Alloc *)0x0;
  bVar14 = ((ulong)this_00 & 7) == 0;
  local_1d8._16_8_ = this_00;
  if (bVar14 && bVar13) {
    if (entering_parallel == '\x01') {
      local_1d8._16_8_ = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_1c0._M_allocated_capacity = uVar10;
  get_codes_to_canonical<int>((Omega_h *)&local_1a8,deg,(Read<int> *)(local_1d8 + 0x10));
  uVar12 = local_1d8._16_8_;
  if ((local_1d8._16_8_ & 7) == 0 && (Alloc *)local_1d8._16_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_1d8._16_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_1d8._16_8_);
      operator_delete((void *)uVar12,0x48);
    }
  }
  local_1e8.write_.shared_alloc_.alloc = this_00;
  if (bVar14 && bVar13) {
    if (entering_parallel == '\x01') {
      local_1e8.write_.shared_alloc_.alloc = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_1e8.write_.shared_alloc_.direct_ptr = (void *)uVar10;
  local_c8.write_.shared_alloc_.alloc = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = local_1a0;
  align_ev2v<int>((Omega_h *)local_188,deg,&local_1e8,&local_c8);
  pAVar2 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_1e8.write_.shared_alloc_.alloc;
  if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1e8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_50.write_.shared_alloc_.alloc = (Alloc *)local_188._0_8_;
  if ((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_188._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_188._0_8_ + 0x30) = *(int *)(local_188._0_8_ + 0x30) + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (void *)local_188._8_8_;
  local_178._32_8_ = (Alloc *)local_188;
  sort_by_keys<int>((Omega_h *)local_148,&local_50,deg);
  pAVar2 = local_50.write_.shared_alloc_.alloc;
  local_178._24_8_ = (Alloc *)local_148;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_e8.write_.shared_alloc_.alloc = (Alloc *)local_188._0_8_;
  if ((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_188._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_188._0_8_ + 0x30) = *(int *)(local_188._0_8_ + 0x30) + 1;
    }
  }
  pAVar2 = local_e8.write_.shared_alloc_.alloc;
  local_e8.write_.shared_alloc_.direct_ptr = (void *)local_188._8_8_;
  local_60.write_.shared_alloc_.alloc = (Alloc *)local_148._0_8_;
  if ((local_148._0_8_ & 7) == 0 && (Alloc *)local_148._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_148._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_148._0_8_ + 0x30) = *(int *)(local_148._0_8_ + 0x30) + 1;
    }
  }
  pAVar6 = local_60.write_.shared_alloc_.alloc;
  local_60.write_.shared_alloc_.direct_ptr = (void *)local_148._8_8_;
  find_canonical_jumps((Omega_h *)&local_d8,deg,&local_e8,&local_60);
  if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  local_108.write_.shared_alloc_.alloc = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.write_.shared_alloc_.alloc = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.direct_ptr = local_d0;
  collect_marked((Omega_h *)&local_f8,&local_108);
  pAVar2 = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_118.write_.shared_alloc_.alloc = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.write_.shared_alloc_.alloc = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_118.write_.shared_alloc_.direct_ptr = local_f0;
  local_80.write_.shared_alloc_.alloc = (Alloc *)local_148._0_8_;
  if ((local_148._0_8_ & 7) == 0 && (Alloc *)local_148._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_148._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_148._0_8_ + 0x30) = *(int *)(local_148._0_8_ + 0x30) + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (void *)local_148._8_8_;
  compound_maps((Omega_h *)&local_70,&local_118,&local_80);
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_118.write_.shared_alloc_.alloc;
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_130._8_8_ = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130._8_8_ = local_70->size * 8 + 1;
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_120 = local_68;
  local_148._16_8_ = this_00;
  if (bVar14 && bVar13) {
    if (entering_parallel == '\x01') {
      local_148._16_8_ = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_130._0_8_ = local_178._16_8_;
  unmap<int>((Omega_h *)&local_90,(LOs *)(local_130 + 8),(Read<int> *)(local_148 + 0x10),deg);
  pAVar2 = local_b8;
  Read<int>::Read((Read<signed_char> *)local_b8,&local_90);
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_90.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.shared_alloc_.alloc);
      operator_delete(local_90.shared_alloc_.alloc,0x48);
    }
  }
  uVar10 = local_148._16_8_;
  if ((local_148._16_8_ & 7) == 0 && (Alloc *)local_148._16_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_148._16_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_148._16_8_);
      operator_delete((void *)uVar10,0x48);
    }
  }
  uVar10 = local_130._8_8_;
  if ((local_130._8_8_ & 7) == 0 && (Alloc *)local_130._8_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_130._8_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_130._8_8_);
      operator_delete((void *)uVar10,0x48);
    }
  }
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(local_70,0x48);
    }
  }
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    piVar1 = &local_f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8);
      operator_delete(local_f8,0x48);
    }
  }
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar1 = &local_d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(local_d8,0x48);
    }
  }
  if ((local_148._0_8_ & 7) == 0 && (Alloc *)local_148._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_148._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_148._0_8_);
      operator_delete((void *)local_148._0_8_,0x48);
    }
  }
  uVar10 = local_188._0_8_;
  if ((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_188._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_188._0_8_);
      operator_delete((void *)uVar10,0x48);
    }
  }
  pAVar6 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    piVar1 = &local_1a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8);
      operator_delete(pAVar6,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1e9);
  if (bVar14 && bVar13) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if ((local_a0._0_8_ & 7) == 0 && (Alloc *)local_a0._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_a0._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_a0._0_8_);
      operator_delete((void *)local_a0._0_8_,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1ea);
  LVar15.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar15.write_.shared_alloc_.alloc = pAVar2;
  return (LOs)LVar15.write_.shared_alloc_;
}

Assistant:

LOs find_unique(LOs const hv2v, Omega_h_Family const family, Int const high_dim,
    Int const low_dim) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(high_dim > low_dim);
  OMEGA_H_CHECK(low_dim <= 2);
  OMEGA_H_CHECK(hv2v.size() % element_degree(family, high_dim, VERT) == 0);
  auto const uv2v = form_uses(hv2v, family, high_dim, low_dim);
  auto const deg = element_degree(family, low_dim, VERT);
  return find_unique_deg(deg, uv2v);
}